

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APIntOps::GreatestCommonDivisor(APIntOps *this,APInt *A,APInt *B)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  undefined8 extraout_RDX_02;
  APInt *pAVar6;
  APInt AVar7;
  
  bVar1 = APInt::operator==(A,B);
  uVar5 = extraout_RDX;
  pAVar6 = A;
  if (((!bVar1) && (bVar1 = APInt::operator!(A), uVar5 = extraout_RDX_00, pAVar6 = B, !bVar1)) &&
     (bVar1 = APInt::operator!(B), uVar5 = extraout_RDX_01, pAVar6 = A, !bVar1)) {
    uVar2 = APInt::countTrailingZeros(A);
    uVar3 = APInt::countTrailingZeros(B);
    if (uVar2 < uVar3 || uVar2 - uVar3 == 0) {
      uVar4 = uVar3 - uVar2;
      pAVar6 = B;
      if (uVar2 <= uVar3 && uVar4 != 0) goto LAB_0013c2d2;
    }
    else {
      APInt::lshrInPlace(A,uVar2 - uVar3);
      uVar2 = uVar3;
    }
    while (bVar1 = APInt::operator!=(A,B), uVar5 = extraout_RDX_02, pAVar6 = A, bVar1) {
      bVar1 = APInt::ugt(A,B);
      if (bVar1) {
        APInt::operator-=(A,B);
      }
      else {
        APInt::operator-=(B,A);
        pAVar6 = B;
      }
      uVar4 = APInt::countTrailingZeros(pAVar6);
      uVar4 = uVar4 - uVar2;
LAB_0013c2d2:
      APInt::lshrInPlace(pAVar6,uVar4);
    }
  }
  *(uint *)(this + 8) = pAVar6->BitWidth;
  *(anon_union_8_2_1313ab2f_for_U *)this = pAVar6->U;
  pAVar6->BitWidth = 0;
  AVar7._8_8_ = uVar5;
  AVar7.U.pVal = (uint64_t *)this;
  return AVar7;
}

Assistant:

APInt llvm::APIntOps::GreatestCommonDivisor(APInt A, APInt B) {
  // Fast-path a common case.
  if (A == B) return A;

  // Corner cases: if either operand is zero, the other is the gcd.
  if (!A) return B;
  if (!B) return A;

  // Count common powers of 2 and remove all other powers of 2.
  unsigned Pow2;
  {
    unsigned Pow2_A = A.countTrailingZeros();
    unsigned Pow2_B = B.countTrailingZeros();
    if (Pow2_A > Pow2_B) {
      A.lshrInPlace(Pow2_A - Pow2_B);
      Pow2 = Pow2_B;
    } else if (Pow2_B > Pow2_A) {
      B.lshrInPlace(Pow2_B - Pow2_A);
      Pow2 = Pow2_A;
    } else {
      Pow2 = Pow2_A;
    }
  }

  // Both operands are odd multiples of 2^Pow_2:
  //
  //   gcd(a, b) = gcd(|a - b| / 2^i, min(a, b))
  //
  // This is a modified version of Stein's algorithm, taking advantage of
  // efficient countTrailingZeros().
  while (A != B) {
    if (A.ugt(B)) {
      A -= B;
      A.lshrInPlace(A.countTrailingZeros() - Pow2);
    } else {
      B -= A;
      B.lshrInPlace(B.countTrailingZeros() - Pow2);
    }
  }

  return A;
}